

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint8_t uVar1;
  ostream *poVar2;
  uint8_t *puVar3;
  _Elt_pointer pPVar4;
  uint64_t uVar5;
  uint32_t i_1;
  long lVar6;
  _Map_pointer ppPVar7;
  uint32_t cs;
  uint uVar8;
  ulong uVar9;
  _Elt_pointer pPVar10;
  uint8_t i;
  uint64_t uVar11;
  Packet *pPVar12;
  int iVar13;
  Packet *this;
  unique_ptr<ixy::IxyDevice,_std::default_delete<ixy::IxyDevice>_> dev;
  _Map_pointer local_e8;
  shared_ptr<ixy::Mempool> pool;
  deque<ixy::Packet,_std::allocator<ixy::Packet>_> buffer;
  device_stats stats1;
  device_stats local_58;
  
  if (argc != 2) {
    poVar2 = std::operator<<((ostream *)&std::cout,*argv);
    poVar2 = std::operator<<(poVar2," generates packets on a single port.");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"Usage: ");
    poVar2 = std::operator<<(poVar2,*argv);
    poVar2 = std::operator<<(poVar2," <pci bus id1>");
    std::endl<char,std::char_traits<char>>(poVar2);
    return 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buffer,argv[1],(allocator<char> *)&stats1);
  ixy::ixy_init((ixy *)&dev,(string *)&buffer,1,1);
  std::__cxx11::string::~string((string *)&buffer);
  ixy::Mempool::allocate((Mempool *)&pool,0x800,0);
  std::_Deque_base<ixy::Packet,_std::allocator<ixy::Packet>_>::_Deque_base
            (&buffer.super__Deque_base<ixy::Packet,_std::allocator<ixy::Packet>_>);
  ixy::Mempool::alloc_pkt_batch(&pool,&buffer,0x800,0x3c);
  pPVar10 = buffer.super__Deque_base<ixy::Packet,_std::allocator<ixy::Packet>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  local_e8 = buffer.super__Deque_base<ixy::Packet,_std::allocator<ixy::Packet>_>._M_impl.
             super__Deque_impl_data._M_start._M_node;
  pPVar12 = buffer.super__Deque_base<ixy::Packet,_std::allocator<ixy::Packet>_>._M_impl.
            super__Deque_impl_data._M_start._M_last;
  this = buffer.super__Deque_base<ixy::Packet,_std::allocator<ixy::Packet>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur;
  while (this != pPVar10) {
    for (uVar11 = 0; uVar11 != 0x2d; uVar11 = uVar11 + 1) {
      uVar1 = "\x01\x02\x03\x04\x05\x06\x10\x10\x10\x10\x10\x10\b"[uVar11];
      puVar3 = ixy::Packet::at(this,uVar11);
      *puVar3 = uVar1;
    }
    uVar8 = 0;
    for (lVar6 = 0; lVar6 != 10; lVar6 = lVar6 + 1) {
      uVar8 = uVar8 + *(ushort *)(this->addr_virt + lVar6 * 2 + 0xe);
      if (0xffff < uVar8) {
        uVar8 = (uVar8 & 0xffff) + 1;
      }
    }
    puVar3 = ixy::Packet::at(this,0x18);
    *puVar3 = (uint8_t)(~uVar8 >> 8);
    puVar3 = ixy::Packet::at(this,0x19);
    *puVar3 = (uint8_t)~uVar8;
    this = this + 1;
    if (this == pPVar12) {
      this = local_e8[1];
      local_e8 = local_e8 + 1;
      pPVar12 = this + 10;
    }
  }
  std::deque<ixy::Packet,_std::allocator<ixy::Packet>_>::~deque(&buffer);
  stats1.dev = (IxyDevice *)
               dev._M_t.super___uniq_ptr_impl<ixy::IxyDevice,_std::default_delete<ixy::IxyDevice>_>.
               _M_t.super__Tuple_impl<0UL,_ixy::IxyDevice_*,_std::default_delete<ixy::IxyDevice>_>.
               super__Head_base<0UL,_ixy::IxyDevice_*,_false>._M_head_impl;
  stats1.rx_pkts = 0;
  stats1.tx_pkts = 0;
  stats1.rx_bytes = 0;
  stats1.tx_bytes = 0;
  (**(code **)(*(long *)dev._M_t.
                        super___uniq_ptr_impl<ixy::IxyDevice,_std::default_delete<ixy::IxyDevice>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_ixy::IxyDevice_*,_std::default_delete<ixy::IxyDevice>_>
                        .super__Head_base<0UL,_ixy::IxyDevice_*,_false>._M_head_impl + 0x48))();
  local_58.dev = (IxyDevice *)
                 dev._M_t.
                 super___uniq_ptr_impl<ixy::IxyDevice,_std::default_delete<ixy::IxyDevice>_>._M_t.
                 super__Tuple_impl<0UL,_ixy::IxyDevice_*,_std::default_delete<ixy::IxyDevice>_>.
                 super__Head_base<0UL,_ixy::IxyDevice_*,_false>._M_head_impl;
  local_58.rx_pkts = 0;
  local_58.tx_pkts = 0;
  local_58.rx_bytes = 0;
  local_58.tx_bytes = 0;
  (**(code **)(*(long *)dev._M_t.
                        super___uniq_ptr_impl<ixy::IxyDevice,_std::default_delete<ixy::IxyDevice>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_ixy::IxyDevice_*,_std::default_delete<ixy::IxyDevice>_>
                        .super__Head_base<0UL,_ixy::IxyDevice_*,_false>._M_head_impl + 0x48))();
  std::_Deque_base<ixy::Packet,_std::allocator<ixy::Packet>_>::_Deque_base
            (&buffer.super__Deque_base<ixy::Packet,_std::allocator<ixy::Packet>_>);
  uVar9 = 0;
  uVar11 = ixy::monotonic_time();
  iVar13 = 0;
  do {
    ixy::Mempool::alloc_pkt_batch(&pool,&buffer,0x20,0x3c);
    pPVar4 = buffer.super__Deque_base<ixy::Packet,_std::allocator<ixy::Packet>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    ppPVar7 = buffer.super__Deque_base<ixy::Packet,_std::allocator<ixy::Packet>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
    pPVar10 = buffer.super__Deque_base<ixy::Packet,_std::allocator<ixy::Packet>_>._M_impl.
              super__Deque_impl_data._M_start._M_last;
    while (pPVar4 != buffer.super__Deque_base<ixy::Packet,_std::allocator<ixy::Packet>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_cur) {
      *(int *)(pPVar4->addr_virt + 0x38) = iVar13;
      iVar13 = iVar13 + 1;
      pPVar4 = pPVar4 + 1;
      if (pPVar4 == pPVar10) {
        pPVar4 = ppPVar7[1];
        ppPVar7 = ppPVar7 + 1;
        pPVar10 = pPVar4 + 10;
      }
    }
    (**(code **)(*(long *)dev._M_t.
                          super___uniq_ptr_impl<ixy::IxyDevice,_std::default_delete<ixy::IxyDevice>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_ixy::IxyDevice_*,_std::default_delete<ixy::IxyDevice>_>
                          .super__Head_base<0UL,_ixy::IxyDevice_*,_false>._M_head_impl + 0x38))
              (dev._M_t.super___uniq_ptr_impl<ixy::IxyDevice,_std::default_delete<ixy::IxyDevice>_>.
               _M_t.super__Tuple_impl<0UL,_ixy::IxyDevice_*,_std::default_delete<ixy::IxyDevice>_>.
               super__Head_base<0UL,_ixy::IxyDevice_*,_false>._M_head_impl,0,&buffer);
    if ((uVar9 & 0xfff) == 0) {
      uVar5 = ixy::monotonic_time();
      if (1000000000 < uVar5 - uVar11) {
        (**(code **)(*(long *)dev._M_t.
                              super___uniq_ptr_impl<ixy::IxyDevice,_std::default_delete<ixy::IxyDevice>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_ixy::IxyDevice_*,_std::default_delete<ixy::IxyDevice>_>
                              .super__Head_base<0UL,_ixy::IxyDevice_*,_false>._M_head_impl + 0x40))
                  (dev._M_t.
                   super___uniq_ptr_impl<ixy::IxyDevice,_std::default_delete<ixy::IxyDevice>_>._M_t.
                   super__Tuple_impl<0UL,_ixy::IxyDevice_*,_std::default_delete<ixy::IxyDevice>_>.
                   super__Head_base<0UL,_ixy::IxyDevice_*,_false>._M_head_impl,&stats1);
        ixy::device_stats::print_stats_diff(&local_58,&stats1,uVar5 - uVar11);
        local_58.rx_pkts = stats1.rx_pkts;
        local_58.tx_pkts = stats1.tx_pkts;
        local_58.rx_bytes = stats1.rx_bytes;
        local_58.tx_bytes = stats1.tx_bytes;
        uVar11 = uVar5;
      }
    }
    uVar9 = uVar9 + 1;
    std::deque<ixy::Packet,_std::allocator<ixy::Packet>_>::clear(&buffer);
  } while( true );
}

Assistant:

auto main(int argc, char *argv[]) -> int {
    if (argc != 2) {
        std::cout << argv[0] << " generates packets on a single port." << std::endl;
        std::cout << "Usage: " << argv[0] << " <pci bus id1>" << std::endl;
        return 1;
    }

    auto dev = ixy_init(argv[1], 1, 1);

    auto pool = Mempool::allocate(NUM_PACKETS, 0);

    // pre-fill all packet buffer in the pool with data and return them to the packet pool
    {
        std::deque<Packet> buffer;

        Mempool::alloc_pkt_batch(pool, buffer, NUM_PACKETS, PACKET_SIZE);

        for (auto &p : buffer) {
            for (uint8_t i = 0; i < sizeof(pkt_data); i++) {
                p.at(i) = pkt_data[i];
            }

            auto checksum = calc_ip_checksum(p.get_virt_addr() + 14, 20);

            p.at(24) = (checksum >> 8);
            p.at(25) = (checksum & 0xff);
        }
    }

    struct device_stats stats1{*dev}, stats1_old{*dev};

    std::deque<Packet> buffer;
    uint64_t counter = 0;
    uint32_t seq_num = 0;

    auto last_stats_printed = monotonic_time();

    while (true) {
        // re-fill our packet queue with new packets to send out
        Mempool::alloc_pkt_batch(pool, buffer, BATCH_SIZE, PACKET_SIZE);

        // update sequence number of all packets (and checksum if necessary)
        for (auto &p : buffer) {
            *(uint32_t *) (p.get_virt_addr() + PACKET_SIZE - 4) = seq_num++;
        }

        dev->tx_batch(0, buffer);

        // don't poll the time unnecessarily
        if ((counter++ & 0xfff) == 0) {
            auto time = monotonic_time();
            if (time - last_stats_printed > 1000 * 1000 * 1000) {
                // every second
                dev->read_stats(stats1);
                stats1_old.print_stats_diff(stats1, time - last_stats_printed);
                stats1_old = stats1;

                last_stats_printed = time;
            }
        }

        buffer.clear();
    }
}